

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

Am_Object gen_value_script_list_or_value
                    (char *line,Am_Object *group,Am_Object *cmd,Am_Value *v,Am_Slot_Key slot,
                    bool output_eq,bool output_slot_name)

{
  char cVar1;
  ostream *poVar2;
  undefined6 in_register_00000082;
  undefined7 in_register_00000089;
  char in_stack_00000010;
  Am_Am_Slot_Key local_1a2;
  undefined8 local_1a0;
  ostrstream oss3;
  
  local_1a0 = CONCAT62(in_register_00000082,slot);
  std::ostrstream::ostrstream(&oss3,(char *)group,300,_S_out);
  reset_ostrstream(&oss3);
  if (output_slot_name) {
    cVar1 = find_placeholder_char((Am_Object *)v,0x169);
    if (cVar1 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss3," ",1);
      local_1a2.value._0_1_ = cVar1;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&oss3,(char *)&local_1a2,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss3," :",2);
  }
  if (in_stack_00000010 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&oss3," ",1);
    local_1a2.value = (Am_Slot_Key)CONCAT71(in_register_00000089,output_eq);
    poVar2 = operator<<((ostream *)&oss3,&local_1a2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
  }
  gen_script_list_or_value
            (line,(ostrstream *)group,(Am_Object *)&oss3,&Am_Script_Line_Value,cmd,v,
             SUB81(local_1a0,0),(Am_Object *)0x0,(Am_Value_List *)cmd);
  Am_Object::Set((Am_Object *)line,0xb8,(uint)CONCAT71(in_register_00000089,output_eq) & 0xffff,1);
  std::ostrstream::~ostrstream(&oss3);
  return (Am_Object)(Am_Object_Data *)line;
}

Assistant:

Am_Object
gen_value_script_list_or_value(char *line, Am_Object &group, Am_Object &cmd,
                               Am_Value &v, Am_Slot_Key slot, bool output_eq,
                               bool output_slot_name)
{
  OSTRSTREAM_CONSTR(oss3, line, 300, std::ios::out);
  reset_ostrstream(oss3); // go to the beginning
  if (output_eq) {
    char placeholder_char = find_placeholder_char(cmd, Am_VALUE);
    if (placeholder_char)
      oss3 << " " << placeholder_char << ":";
    oss3 << " :";
  }
  if (output_slot_name) {
    oss3 << " " << Am_Am_Slot_Key(slot) << "=";
  }
  Am_Object script_line_part =
      gen_script_list_or_value(line, oss3, Am_Script_Line_Value, group, cmd, v,
                               false, group, Am_No_Value_List);
  script_line_part.Set(Am_SLOTS_TO_SAVE, slot, Am_OK_IF_NOT_THERE);
  return script_line_part;
}